

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O2

tcache_t * tcache_create_explicit(tsd_t *tsd)

{
  long *plVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  undefined8 uVar8;
  arena_t *paVar9;
  tsd_t *tsd_00;
  ulong uVar10;
  rtree_leaf_elm_t *prVar11;
  _Bool internal;
  uint uVar12;
  rtree_leaf_elm_t *extraout_RDX;
  rtree_leaf_elm_t *extraout_RDX_00;
  rtree_leaf_elm_t *extraout_RDX_01;
  rtree_leaf_elm_t *avail_stack;
  rtree_leaf_elm_t *extraout_RDX_02;
  rtree_leaf_elm_t *extraout_RDX_03;
  ulong uVar13;
  size_t usize;
  rtree_ctx_t *prVar14;
  rtree_ctx_t local_1b0;
  
  if ((ulong)stack_nelms < 0x438) {
    uVar12 = stack_nelms * 8 + 0x1687 & 0x7fc0;
    if (uVar12 < 0x1001) {
      usize = sz_index2size_tab[sz_size2index_tab[uVar12 >> 3]];
    }
    else {
      uVar10 = (ulong)uVar12 * 2 - 1;
      lVar7 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      uVar10 = ~(-1L << ((char)lVar7 - 3U & 0x3f));
      if ((uint)lVar7 < 7) {
        uVar10 = 0xf;
      }
      usize = ~uVar10 & uVar10 + uVar12;
    }
    if (usize < 0x4000) goto LAB_0013e0cf;
  }
  else if (0x537 < stack_nelms) {
    uVar10 = (ulong)stack_nelms * 8 + 0x1648;
    uVar13 = uVar10 * 2 - 1;
    lVar7 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    uVar13 = ~(-1L << ((char)lVar7 - 3U & 0x3f));
    if ((uint)lVar7 < 7) {
      uVar13 = 0xf;
    }
    usize = ~uVar13 & uVar13 + uVar10;
    if (usize < uVar10) {
      usize = 0;
    }
    else if (0xffffffffffffefff < usize) {
      usize = 0;
    }
    goto LAB_0013e0cf;
  }
  usize = 0x4000;
LAB_0013e0cf:
  paVar9 = arena_get((tsdn_t *)0x0,0,true);
  tsd_00 = (tsd_t *)arena_palloc((tsdn_t *)tsd,paVar9,usize,0x40,true,(tcache_t *)0x0);
  if (tsd_00 != (tsd_t *)0x0) {
    if (tsd == (tsd_t *)0x0) {
      prVar14 = &local_1b0;
      rtree_ctx_data_init(prVar14);
      avail_stack = extraout_RDX_00;
    }
    else {
      prVar14 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      avail_stack = extraout_RDX;
    }
    uVar12 = (uint)((ulong)tsd_00 >> 0x1e) & 0xf;
    uVar13 = (ulong)tsd_00 & 0xffffffffc0000000;
    uVar10 = (ulong)(uVar12 << 4);
    puVar2 = (ulong *)((long)&prVar14->cache[0].leafkey + uVar10);
    uVar10 = *(ulong *)((long)&prVar14->cache[0].leafkey + uVar10);
    if (uVar10 == uVar13) {
      prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)tsd_00 >> 9) & 0x1ffff8) + puVar2[1]);
    }
    else if (prVar14->l2_cache[0].leafkey == uVar13) {
      avail_stack = prVar14->l2_cache[0].leaf;
      prVar14->l2_cache[0].leafkey = uVar10;
      prVar14->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar13;
      puVar2[1] = (ulong)avail_stack;
      prVar11 = (rtree_leaf_elm_t *)
                ((long)&(avail_stack->le_bits).repr + (ulong)((uint)((ulong)tsd_00 >> 9) & 0x1ffff8)
                );
    }
    else {
      for (avail_stack = (rtree_leaf_elm_t *)0x118; avail_stack != (rtree_leaf_elm_t *)0x188;
          avail_stack = avail_stack + 2) {
        if (*(ulong *)((long)&prVar14[-1].l2_cache[7].leaf + (long)avail_stack) == uVar13) {
          uVar6 = *(ulong *)((long)&prVar14->cache[0].leafkey + (long)&(avail_stack->le_bits).repr);
          puVar3 = (undefined8 *)((long)&prVar14[-1].l2_cache[6].leaf + (long)avail_stack);
          uVar8 = puVar3[1];
          puVar4 = (undefined8 *)((long)&prVar14[-1].l2_cache[7].leaf + (long)avail_stack);
          *puVar4 = *puVar3;
          puVar4[1] = uVar8;
          *(ulong *)((long)&prVar14[-1].l2_cache[6].leaf + (long)avail_stack) = uVar10;
          *(ulong *)((long)&(avail_stack->le_bits).repr + (long)&prVar14[-1].l2_cache[7].leafkey) =
               puVar2[1];
          *puVar2 = uVar13;
          puVar2[1] = uVar6;
          prVar11 = (rtree_leaf_elm_t *)(((uint)((ulong)tsd_00 >> 9) & 0x1ffff8) + uVar6);
          goto LAB_0013e148;
        }
      }
      prVar11 = rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd,&extents_rtree,prVar14,(uintptr_t)tsd_00,true,false);
      avail_stack = extraout_RDX_02;
    }
LAB_0013e148:
    pvVar5 = arenas[*(uint *)(((long)(prVar11->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe)
                    & 0xfff].repr;
    if (tsd == (tsd_t *)0x0) {
      prVar14 = &local_1b0;
      rtree_ctx_data_init(prVar14);
      avail_stack = extraout_RDX_01;
    }
    else {
      prVar14 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    uVar10 = (ulong)(uVar12 << 4);
    puVar2 = (ulong *)((long)&prVar14->cache[0].leafkey + uVar10);
    uVar10 = *(ulong *)((long)&prVar14->cache[0].leafkey + uVar10);
    if (uVar10 == uVar13) {
      prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)tsd_00 >> 9) & 0x1ffff8) + puVar2[1]);
    }
    else if (prVar14->l2_cache[0].leafkey == uVar13) {
      avail_stack = prVar14->l2_cache[0].leaf;
      prVar14->l2_cache[0].leafkey = uVar10;
      prVar14->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar13;
      puVar2[1] = (ulong)avail_stack;
      prVar11 = (rtree_leaf_elm_t *)
                ((long)&(avail_stack->le_bits).repr + (ulong)((uint)((ulong)tsd_00 >> 9) & 0x1ffff8)
                );
    }
    else {
      for (avail_stack = (rtree_leaf_elm_t *)0x118; avail_stack != (rtree_leaf_elm_t *)0x188;
          avail_stack = avail_stack + 2) {
        if (*(ulong *)((long)&prVar14[-1].l2_cache[7].leaf + (long)avail_stack) == uVar13) {
          uVar6 = *(ulong *)((long)&prVar14->cache[0].leafkey + (long)&(avail_stack->le_bits).repr);
          puVar3 = (undefined8 *)((long)&prVar14[-1].l2_cache[6].leaf + (long)avail_stack);
          uVar8 = puVar3[1];
          puVar4 = (undefined8 *)((long)&prVar14[-1].l2_cache[7].leaf + (long)avail_stack);
          *puVar4 = *puVar3;
          puVar4[1] = uVar8;
          *(ulong *)((long)&prVar14[-1].l2_cache[6].leaf + (long)avail_stack) = uVar10;
          *(ulong *)((long)&(avail_stack->le_bits).repr + (long)&prVar14[-1].l2_cache[7].leafkey) =
               puVar2[1];
          *puVar2 = uVar13;
          puVar2[1] = uVar6;
          prVar11 = (rtree_leaf_elm_t *)(((uint)((ulong)tsd_00 >> 9) & 0x1ffff8) + uVar6);
          goto LAB_0013e19a;
        }
      }
      prVar11 = rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd,&extents_rtree,prVar14,(uintptr_t)tsd_00,true,false);
      avail_stack = extraout_RDX_03;
    }
LAB_0013e19a:
    LOCK();
    plVar1 = (long *)((long)pvVar5 + 0x68);
    *plVar1 = *plVar1 + sz_index2size_tab[(ulong)(prVar11->le_bits).repr >> 0x30];
    UNLOCK();
    tcache_init(tsd_00,(tcache_t *)
                       &(tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).
                        bins_large[0xaf].tstats,avail_stack);
    paVar9 = arena_choose_impl(tsd,(arena_t *)0x1,internal);
    tcache_arena_associate((tsdn_t *)tsd,(tcache_t *)tsd_00,paVar9);
  }
  return (tcache_t *)tsd_00;
}

Assistant:

tcache_t *
tcache_create_explicit(tsd_t *tsd) {
	tcache_t *tcache;
	size_t size, stack_offset;

	size = sizeof(tcache_t);
	/* Naturally align the pointer stacks. */
	size = PTR_CEILING(size);
	stack_offset = size;
	size += stack_nelms * sizeof(void *);
	/* Avoid false cacheline sharing. */
	size = sz_sa2u(size, CACHELINE);

	tcache = ipallocztm(tsd_tsdn(tsd), size, CACHELINE, true, NULL, true,
	    arena_get(TSDN_NULL, 0, true));
	if (tcache == NULL) {
		return NULL;
	}

	tcache_init(tsd, tcache,
	    (void *)((uintptr_t)tcache + (uintptr_t)stack_offset));
	tcache_arena_associate(tsd_tsdn(tsd), tcache, arena_ichoose(tsd, NULL));

	return tcache;
}